

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::tab_r::h2_to_u2_std_radial(tab_r *this,vec3 *wm,float_t zi,float_t param_3)

{
  float_t fVar1;
  float u1_00;
  float fVar2;
  float_t y;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  float local_44;
  float_t u2;
  float_t u1;
  float_t pm;
  float_t param_3_local;
  float_t zi_local;
  vec3 *wm_local;
  tab_r *this_local;
  
  if (1.0 < wm->z || wm->z == 1.0) {
    local_44 = 0.0;
  }
  else {
    dVar3 = std::atan2((double)(ulong)(uint)wm->y,(double)(ulong)(uint)wm->x);
    local_44 = SUB84(dVar3,0);
  }
  fVar1 = m_pi();
  u1_00 = (local_44 / fVar1 + 1.0) * 0.5;
  fVar2 = sat<float>(&wm->z);
  dVar3 = std::acos((double)CONCAT44(extraout_XMM0_Db,fVar2));
  fVar1 = m_pi();
  dVar3 = std::sqrt((double)(ulong)(uint)(SUB84(dVar3,0) * (2.0 / fVar1)));
  fVar1 = cdf1(this,u1_00,zi);
  y = cdf2(this,SUB84(dVar3,0),u1_00,zi);
  vec2::vec2((vec2 *)&this_local,fVar1,y);
  return (vec2)this_local;
}

Assistant:

vec2 tab_r::h2_to_u2_std_radial(const vec3 &wm, float_t zi, float_t) const
{
	float_t pm = wm.z < 1 ? atan2(wm.y, wm.x) : 0;
	float_t u1 = (pm / m_pi() + 1) / 2;
	float_t u2 = sqrt(acos(sat(wm.z)) * (2 / m_pi()));

	return vec2(cdf1(u1, zi), cdf2(u2, u1, zi));
}